

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool get_commasep_word(ptrlen *list,ptrlen *word)

{
  char *__s;
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  size_t __n;
  
  __n = list->len;
  do {
    if (__n == 0) {
LAB_0011a4c3:
      return __n != 0;
    }
    __s = (char *)list->ptr;
    if (*__s != ',') {
      pvVar1 = memchr(__s,0x2c,__n);
      if (pvVar1 == (void *)0x0) {
        sVar3 = list->len;
        word->ptr = list->ptr;
        word->len = sVar3;
        sVar3 = 0;
      }
      else {
        uVar2 = (long)pvVar1 - (long)__s;
        word->ptr = __s;
        word->len = uVar2;
        list->ptr = (void *)((long)list->ptr + uVar2 + 1);
        sVar3 = ~uVar2 + list->len;
      }
      list->len = sVar3;
      goto LAB_0011a4c3;
    }
    list->ptr = __s + 1;
    __n = __n - 1;
    list->len = __n;
  } while( true );
}

Assistant:

bool get_commasep_word(ptrlen *list, ptrlen *word)
{
    const char *comma;

    /*
     * Discard empty list elements, should there be any, because we
     * never want to return one as if it was a real string. (This
     * introduces a mild tolerance of badly formatted data in lists we
     * receive, but I think that's acceptable.)
     */
    while (list->len > 0 && *(const char *)list->ptr == ',') {
        list->ptr = (const char *)list->ptr + 1;
        list->len--;
    }

    if (!list->len)
        return false;

    comma = memchr(list->ptr, ',', list->len);
    if (!comma) {
        *word = *list;
        list->len = 0;
    } else {
        size_t wordlen = comma - (const char *)list->ptr;
        word->ptr = list->ptr;
        word->len = wordlen;
        list->ptr = (const char *)list->ptr + wordlen + 1;
        list->len -= wordlen + 1;
    }
    return true;
}